

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_highbd_convolve_horiz_rs_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint16_t *puVar11;
  uint uVar12;
  uint16_t uVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar24 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar25;
  
  if (0 < h) {
    puVar11 = src + -3;
    iVar15 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        uVar12 = x0_qn;
        do {
          iVar17 = 0;
          iVar18 = 0;
          iVar19 = 0;
          iVar20 = 0;
          lVar9 = 0;
          do {
            uVar1 = *(ulong *)(puVar11 + ((int)uVar12 >> 0xe) + lVar9);
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3._12_2_ = (short)(uVar1 >> 0x30);
            auVar4._8_2_ = (short)(uVar1 >> 0x20);
            auVar4._0_8_ = uVar1;
            auVar4._10_4_ = auVar3._10_4_;
            auVar6._6_8_ = 0;
            auVar6._0_6_ = auVar4._8_6_;
            auVar5._4_2_ = (short)(uVar1 >> 0x10);
            auVar5._0_4_ = (uint)uVar1;
            auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
            uVar2 = *(ulong *)((long)x_filters + lVar9 * 2 + (ulong)(uVar12 >> 4 & 0x3f0));
            uVar25 = (undefined2)(uVar2 >> 0x30);
            auVar23._8_4_ = 0;
            auVar23._0_8_ = uVar2;
            auVar23._12_2_ = uVar25;
            auVar23._14_2_ = uVar25;
            uVar25 = (undefined2)(uVar2 >> 0x20);
            auVar22._12_4_ = auVar23._12_4_;
            auVar22._8_2_ = 0;
            auVar22._0_8_ = uVar2;
            auVar22._10_2_ = uVar25;
            auVar21._10_6_ = auVar22._10_6_;
            auVar21._8_2_ = uVar25;
            auVar21._0_8_ = uVar2;
            uVar25 = (undefined2)(uVar2 >> 0x10);
            auVar7._4_8_ = auVar21._8_8_;
            auVar7._2_2_ = uVar25;
            auVar7._0_2_ = uVar25;
            auVar24._0_4_ = (int)(short)uVar2;
            auVar24._4_4_ = auVar7._0_4_ >> 0x10;
            auVar24._8_4_ = auVar21._8_4_ >> 0x10;
            auVar24._12_4_ = auVar22._12_4_ >> 0x10;
            iVar17 = iVar17 + auVar24._0_4_ * ((uint)uVar1 & 0xffff);
            iVar18 = iVar18 + auVar5._4_4_ * auVar24._4_4_;
            iVar19 = iVar19 + (int)((auVar24._8_8_ & 0xffffffff) *
                                   ((ulong)auVar4._8_6_ & 0xffffffff));
            iVar20 = iVar20 + (auVar3._10_4_ >> 0x10) * auVar24._12_4_;
            lVar9 = lVar9 + 4;
          } while (lVar9 != 8);
          uVar10 = iVar20 + iVar18 + iVar19 + iVar17 + 0x40 >> 7;
          if (bd == 10) {
            uVar14 = 0x3ff;
            bVar16 = uVar10 < 0x3ff;
          }
          else if (bd == 0xc) {
            bVar16 = uVar10 < 0xfff;
            uVar14 = 0xfff;
          }
          else {
            bVar16 = uVar10 < 0xff;
            uVar14 = 0xff;
          }
          if (bVar16) {
            uVar14 = uVar10;
          }
          uVar13 = (uint16_t)uVar14;
          if ((int)uVar10 < 0) {
            uVar13 = 0;
          }
          dst[uVar8] = uVar13;
          uVar12 = uVar12 + x_step_qn;
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)w);
      }
      dst = dst + dst_stride;
      iVar15 = iVar15 + 1;
      puVar11 = puVar11 + src_stride;
    } while (iVar15 != h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const int16_t *x_filters, int x0_qn,
                                    int x_step_qn, int bd) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}